

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlSerializeText(xmlOutputBufferPtr buf,xmlChar *string,uint flags)

{
  char *data;
  int local_58;
  int local_54;
  int len;
  int val;
  int tempSize;
  char tempBuf [12];
  int offset;
  int c;
  char *base;
  char *tab;
  char *cur;
  uint flags_local;
  xmlChar *string_local;
  xmlOutputBufferPtr buf_local;
  
  if (string == (xmlChar *)0x0) {
    return;
  }
  tab = (char *)string;
  if ((flags & 1) == 0) {
    base = "";
  }
  else {
    base = "";
  }
LAB_0019ee6a:
  data = tab;
  if (*tab == '\0') {
    return;
  }
  tempBuf[4] = -1;
  tempBuf[5] = -1;
  tempBuf[6] = -1;
  tempBuf[7] = -1;
  do {
    tempBuf._8_4_ = ZEXT14((byte)*tab);
    if ((uint)tempBuf._8_4_ < 0x80) {
      tempBuf._4_4_ = SEXT14(base[(int)tempBuf._8_4_]);
      if (-1 < (int)tempBuf._4_4_) break;
    }
    else if ((flags & 2) != 0) break;
    tab = tab + 1;
  } while( true );
  if (data < tab) {
    xmlOutputBufferWrite(buf,(int)tab - (int)data,data);
  }
  if (-1 < (int)tempBuf._4_4_) {
    if (tempBuf._8_4_ == 0) {
      return;
    }
    xmlOutputBufferWrite
              (buf,(int)"\b&#xFFFD;\x04&#9;\x05&#10;\x05&#13;\x06&quot;\x05&amp;\x04&lt;\x04&gt;"
                        [(int)tempBuf._4_4_],
               "\b&#xFFFD;\x04&#9;\x05&#10;\x05&#13;\x06&quot;\x05&amp;\x04&lt;\x04&gt;" +
               (tempBuf._4_4_ + 1));
    tab = tab + 1;
    goto LAB_0019ee6a;
  }
  local_54 = 0;
  local_58 = 4;
  local_54 = xmlGetUTF8Char((uchar *)tab,&local_58);
  if (local_54 < 0) {
    local_54 = 0xfffd;
    tab = tab + 1;
    goto LAB_0019eff7;
  }
  if (local_54 < 0x100) {
    if (((local_54 < 9) || (10 < local_54)) && ((local_54 != 0xd && (local_54 < 0x20)))) {
LAB_0019efdf:
      local_54 = 0xfffd;
    }
  }
  else if ((((local_54 < 0x100) || (0xd7ff < local_54)) &&
           ((local_54 < 0xe000 || (0xfffd < local_54)))) &&
          ((local_54 < 0x10000 || (0x10ffff < local_54)))) goto LAB_0019efdf;
  tab = tab + local_58;
LAB_0019eff7:
  len = xmlSerializeHexCharRef((char *)&val,local_54);
  xmlOutputBufferWrite(buf,len,(char *)&val);
  goto LAB_0019ee6a;
}

Assistant:

static void
xmlSerializeText(xmlOutputBufferPtr buf, const xmlChar *string,
                 unsigned flags) {
    const char *cur;
    const signed char *tab;

    if (string == NULL)
        return;

    if (flags & XML_ESCAPE_ATTR)
        tab = xmlEscapeTabAttr;
    else
        tab = xmlEscapeTab;

    cur = (const char *) string;

    while (*cur != 0) {
        const char *base;
        int c;
        int offset;

        base = cur;
        offset = -1;

        while (1) {
            c = (unsigned char) *cur;

            if (c < 0x80) {
                offset = tab[c];
                if (offset >= 0)
                    break;
            } else if (flags & XML_ESCAPE_NON_ASCII) {
                break;
            }

            cur += 1;
        }

        if (cur > base)
            xmlOutputBufferWrite(buf, cur - base, base);

        if (offset >= 0) {
            if (c == 0)
                break;

            xmlOutputBufferWrite(buf, xmlEscapeContent[offset],
                                 &xmlEscapeContent[offset+1]);
            cur += 1;
        } else {
            char tempBuf[12];
            int tempSize;
            int val = 0, len = 4;

            val = xmlGetUTF8Char((const xmlChar *) cur, &len);
            if (val < 0) {
                val = 0xFFFD;
                cur += 1;
            } else {
                if (!IS_CHAR(val))
                    val = 0xFFFD;
                cur += len;
            }

            tempSize = xmlSerializeHexCharRef(tempBuf, val);
            xmlOutputBufferWrite(buf, tempSize, tempBuf);
        }
    }
}